

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O3

int Cof_ObjLevel(Cof_Man_t *p,Cof_Obj_t *pObj)

{
  Vec_Int_t *pVVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = (uint)pObj;
  if (((int)uVar5 < 0) || (p->nObjs <= (int)uVar5)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pVVar1 = p[2].vCos;
  uVar2 = pVVar1->nSize;
  if ((int)uVar5 < (int)uVar2) {
    if (uVar2 <= uVar5) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    goto LAB_00715ec3;
  }
  uVar4 = uVar5 + 1;
  uVar6 = pVVar1->nCap * 2;
  if ((int)uVar5 < (int)uVar6) {
    if (pVVar1->nCap <= (int)uVar5) {
      if (pVVar1->pArray == (int *)0x0) {
        piVar3 = (int *)malloc((ulong)uVar6 << 2);
      }
      else {
        piVar3 = (int *)realloc(pVVar1->pArray,(ulong)uVar6 << 2);
      }
      pVVar1->pArray = piVar3;
      goto LAB_00715e93;
    }
  }
  else {
    if (pVVar1->pArray == (int *)0x0) {
      piVar3 = (int *)malloc((ulong)uVar4 << 2);
    }
    else {
      piVar3 = (int *)realloc(pVVar1->pArray,(ulong)uVar4 << 2);
    }
    pVVar1->pArray = piVar3;
    uVar6 = uVar4;
LAB_00715e93:
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar1->nCap = uVar6;
    uVar2 = pVVar1->nSize;
  }
  if ((int)uVar2 <= (int)uVar5) {
    memset(pVVar1->pArray + (int)uVar2,0,(ulong)(uVar5 - uVar2) * 4 + 4);
  }
  pVVar1->nSize = uVar4;
LAB_00715ec3:
  return pVVar1->pArray[(ulong)pObj & 0xffffffff];
}

Assistant:

static inline int         Cof_ObjLevel( Cof_Man_t * p, Cof_Obj_t * pObj )             { return Gia_ObjLevel(p->pGia, Gia_ManObj(p->pGia,pObj->Id)); }